

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

qsizetype QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_*>,_const_QString_&>,_char>,_const_QString_&>_>
          ::size(type *p)

{
  qsizetype qVar1;
  qsizetype qVar2;
  type *in_stack_fffffffffffffff0;
  
  qVar1 = QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_*>,_const_QString_&>,_char>_>
          ::size(in_stack_fffffffffffffff0);
  qVar2 = QConcatenable<QString>::size((QString *)0x1c531a);
  return qVar1 + qVar2;
}

Assistant:

static qsizetype size(const type &p)
    {
        return QConcatenableEx<A>::size(p.a) + QConcatenableEx<B>::size(p.b);
    }